

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetScrollHereX(float center_x_ratio)

{
  float fVar1;
  ImGuiWindow *window;
  float fVar2;
  
  window = GImGui->CurrentWindow;
  fVar1 = (window->DC).LastItemRect.Min.x;
  fVar2 = (center_x_ratio + -0.5) * (GImGui->Style).ItemSpacing.x;
  SetScrollFromPosX(window,((window->DC).LastItemRect.Max.x - fVar1) * center_x_ratio +
                           fVar2 + fVar2 + (fVar1 - (window->Pos).x),center_x_ratio);
  return;
}

Assistant:

void ImGui::SetScrollHereX(float center_x_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float target_x = window->DC.LastItemRect.Min.x - window->Pos.x; // Left of last item, in window space
    float last_item_width = window->DC.LastItemRect.GetWidth();
    target_x += (last_item_width * center_x_ratio) + (g.Style.ItemSpacing.x * (center_x_ratio - 0.5f) * 2.0f); // Precisely aim before, in the middle or after the last item.
    SetScrollFromPosX(target_x, center_x_ratio);
}